

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *pOVar2;
  Impl *typeId;
  LazyLoadCallback *extraout_RAX;
  Fault local_a0;
  Fault f;
  undefined1 local_90 [8];
  DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  undefined1 local_58 [24];
  RawSchema *mutableSchema;
  undefined1 local_38 [8];
  Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  LazyLoadCallback *c;
  LazyLoadCallback *_c2068;
  RawSchema *schema_local;
  InitializerImpl *this_local;
  
  _c2068 = (LazyLoadCallback *)ctx;
  schema_local = (RawSchema *)this;
  pOVar2 = (Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *)
           kj::_::readMaybe<capnp::SchemaLoader::LazyLoadCallback_const>(&this->callback);
  if (pOVar2 != (Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *)0x0) {
    lock.ptr = pOVar2;
    (*(code *)pOVar2->disposer->_vptr_Disposer)(pOVar2,this->loader,_c2068->_vptr_LazyLoadCallback);
  }
  if (_c2068[8]._vptr_LazyLoadCallback != (_func_int **)0x0) {
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_38,
               this->loader);
    pOVar2 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                       ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
                        local_38);
    typeId = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar2);
    SchemaLoader::Impl::tryGet((Impl *)local_58,(uint64_t)typeId);
    local_58._16_8_ = local_58._0_8_;
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (RawSchema **)(local_58 + 0x10));
    kj::_::DebugExpression<capnp::_::RawSchema*&>::operator==
              ((DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> *)local_90,
               (DebugExpression<capnp::_::RawSchema*&> *)&f,(RawSchema **)&_c2068);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_90);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema*&,capnp::_::RawSchema_const*&>&,char_const(&)[60]>
                (&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x823,FAILED,"mutableSchema == schema",
                 "_kjCondition,\"A schema not belonging to this loader used its initializer.\"",
                 (DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> *)local_90,
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&local_a0);
    }
    ((ObjectHeader *)(local_58._16_8_ + 0x40))->destructor = (_func_void_void_ptr *)0x0;
    ((ObjectHeader *)(local_58._16_8_ + 0x60))->next = (ObjectHeader *)0x0;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_38);
    _c2068 = extraout_RAX;
  }
  return (int)_c2068;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_SOME(c, callback) {
    c.load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__ || defined(__clang__)
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}